

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::AddCastToTypeInternal
          (duckdb *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          LogicalType *target_type,CastFunctionSet *cast_functions,GetCastFunctionInput *get_input,
          bool try_cast)

{
  shared_ptr<duckdb::BoundParameterData,_true> *this_00;
  ExpressionClass EVar1;
  LogicalTypeId LVar2;
  element_type *peVar3;
  __uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> _Var4;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var5;
  bool bVar6;
  pointer pEVar7;
  BoundParameterExpression *pBVar8;
  BoundParameterData *pBVar9;
  BoundDefaultExpression *pBVar10;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var11;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *other;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_68;
  BoundCastInfo local_60;
  BoundCastInfo local_48;
  
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  EVar1 = (pEVar7->super_BaseExpression).expression_class;
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  if (EVar1 == BOUND_PARAMETER) {
    pBVar8 = BaseExpression::Cast<duckdb::BoundParameterExpression>(&pEVar7->super_BaseExpression);
    bVar6 = LogicalType::IsValid(target_type);
    if (bVar6) {
      this_00 = &pBVar8->parameter_data;
      pBVar9 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      if ((pBVar9->return_type).id_ == INVALID) {
        if (&(pBVar8->super_Expression).return_type != target_type) {
          (pBVar8->super_Expression).return_type.id_ = target_type->id_;
          (pBVar8->super_Expression).return_type.physical_type_ = target_type->physical_type_;
          other = &target_type->type_info_;
LAB_006af0ae:
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(pBVar8->super_Expression).return_type.type_info_,other);
        }
        goto LAB_006af0b3;
      }
      pBVar9 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      LVar2 = (pBVar9->return_type).id_;
      pBVar9 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      if (LVar2 == UNKNOWN) {
        if (&pBVar9->return_type != target_type) {
          (pBVar9->return_type).id_ = target_type->id_;
          (pBVar9->return_type).physical_type_ = target_type->physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(pBVar9->return_type).type_info_,&target_type->type_info_);
        }
      }
      else {
        bVar6 = LogicalType::operator==(&pBVar9->return_type,target_type);
        if (bVar6) {
          pBVar9 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
          if (&(pBVar8->super_Expression).return_type != &pBVar9->return_type) {
            (pBVar8->super_Expression).return_type.id_ = (pBVar9->return_type).id_;
            (pBVar8->super_Expression).return_type.physical_type_ =
                 (pBVar9->return_type).physical_type_;
            other = &(pBVar9->return_type).type_info_;
            goto LAB_006af0ae;
          }
          goto LAB_006af0b3;
        }
        LogicalType::LogicalType((LogicalType *)&local_60,INVALID);
        pBVar9 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
        (pBVar9->return_type).id_ = (LogicalTypeId)local_60.function;
        (pBVar9->return_type).physical_type_ = local_60.function._1_1_;
        peVar3 = (pBVar9->return_type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        _Var5._M_head_impl =
             (BoundCastData *)
             (pBVar9->return_type).type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        (pBVar9->return_type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_60.init_local_state;
        (pBVar9->return_type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_60.cast_data.
             super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
             .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
        local_60.init_local_state = (init_cast_local_state_t)peVar3;
        local_60.cast_data.
        super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
        .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
             (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
             (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
             _Var5._M_head_impl;
        LogicalType::~LogicalType((LogicalType *)&local_60);
      }
    }
    else {
      LogicalType::LogicalType((LogicalType *)&local_60,INVALID);
      pBVar9 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(&pBVar8->parameter_data);
      (pBVar9->return_type).id_ = (LogicalTypeId)local_60.function;
      (pBVar9->return_type).physical_type_ = local_60.function._1_1_;
      peVar3 = (pBVar9->return_type).type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var4._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
           (pBVar9->return_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pBVar9->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_60.init_local_state;
      (pBVar9->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_60.cast_data.
           super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      local_60.init_local_state = (init_cast_local_state_t)peVar3;
      local_60.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           _Var4._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      LogicalType::~LogicalType((LogicalType *)&local_60);
    }
    if (&(pBVar8->super_Expression).return_type != target_type) {
      (pBVar8->super_Expression).return_type.id_ = target_type->id_;
      (pBVar8->super_Expression).return_type.physical_type_ = target_type->physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(pBVar8->super_Expression).return_type.type_info_,&target_type->type_info_);
    }
    _Var11._M_head_impl =
         (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  }
  else {
    if ((pEVar7->super_BaseExpression).expression_class == BOUND_DEFAULT) {
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(expr);
      pBVar10 = BaseExpression::Cast<duckdb::BoundDefaultExpression>(&pEVar7->super_BaseExpression);
      if (&(pBVar10->super_Expression).return_type != target_type) {
        (pBVar10->super_Expression).return_type.id_ = target_type->id_;
        (pBVar10->super_Expression).return_type.physical_type_ = target_type->physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(pBVar10->super_Expression).return_type.type_info_,&target_type->type_info_);
      }
    }
    bVar6 = LogicalType::IsValid(target_type);
    if (bVar6) {
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(expr);
      CastFunctionSet::GetCastFunction
                (&local_60,cast_functions,&pEVar7->return_type,target_type,get_input);
      local_68._M_head_impl =
           (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      local_48.init_local_state = local_60.init_local_state;
      local_48.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           local_60.cast_data.
           super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      local_60.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
            )0x0;
      AddCastExpressionInternal
                (this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&local_68,target_type,&local_48,try_cast);
      if (local_48.cast_data.
          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_48.cast_data.
                              super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
                              .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl +
                    8))();
      }
      local_48.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
            )0x0;
      if (local_68._M_head_impl != (Expression *)0x0) {
        (*((local_68._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_68._M_head_impl = (Expression *)0x0;
      if (local_60.cast_data.
          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl ==
          (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
           )0x0) {
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
      }
      (**(code **)(*(long *)local_60.cast_data.
                            super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
                            .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl + 8)
      )();
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
    }
LAB_006af0b3:
    _Var11._M_head_impl =
         (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  }
  *(Expression **)this = _Var11._M_head_impl;
  (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> AddCastToTypeInternal(unique_ptr<Expression> expr, const LogicalType &target_type,
                                             CastFunctionSet &cast_functions, GetCastFunctionInput &get_input,
                                             bool try_cast) {
	D_ASSERT(expr);
	if (expr->GetExpressionClass() == ExpressionClass::BOUND_PARAMETER) {
		auto &parameter = expr->Cast<BoundParameterExpression>();
		if (!target_type.IsValid()) {
			// invalidate the parameter
			parameter.parameter_data->return_type = LogicalType::INVALID;
			parameter.return_type = target_type;
			return expr;
		}
		if (parameter.parameter_data->return_type.id() == LogicalTypeId::INVALID) {
			// we don't know the type of this parameter
			parameter.return_type = target_type;
			return expr;
		}
		if (parameter.parameter_data->return_type.id() == LogicalTypeId::UNKNOWN) {
			// prepared statement parameter cast - but there is no type, convert the type
			parameter.parameter_data->return_type = target_type;
			parameter.return_type = target_type;
			return expr;
		}
		// prepared statement parameter already has a type
		if (parameter.parameter_data->return_type == target_type) {
			// this type! we are done
			parameter.return_type = parameter.parameter_data->return_type;
			return expr;
		}
		// invalidate the type
		parameter.parameter_data->return_type = LogicalType::INVALID;
		parameter.return_type = target_type;
		return expr;
	} else if (expr->GetExpressionClass() == ExpressionClass::BOUND_DEFAULT) {
		D_ASSERT(target_type.IsValid());
		auto &def = expr->Cast<BoundDefaultExpression>();
		def.return_type = target_type;
	}
	if (!target_type.IsValid()) {
		return expr;
	}

	auto cast_function = cast_functions.GetCastFunction(expr->return_type, target_type, get_input);
	return AddCastExpressionInternal(std::move(expr), target_type, std::move(cast_function), try_cast);
}